

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::InternalSwap
          (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this,
          RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *other)

{
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *other_local;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }